

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O1

void Nwk_ManGraphPrepare(Nwk_Grf_t *p)

{
  size_t __size;
  size_t __size_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  Nwk_Edg_t **ppNVar4;
  Nwk_Vrt_t *pNVar5;
  bool bVar6;
  int *piVar7;
  int *piVar8;
  ulong uVar9;
  void *__ptr;
  Aig_MmFlex_t *pAVar10;
  Nwk_Vrt_t **ppNVar11;
  Nwk_Vrt_t *pNVar12;
  int iVar13;
  Nwk_Edg_t *pNVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  
  __size = (long)p->nObjs * 4 + 4;
  piVar7 = (int *)malloc(__size);
  p->pMapLut2Id = piVar7;
  __size_00 = (long)p->nVertsMax * 4 + 4;
  piVar8 = (int *)malloc(__size_00);
  p->pMapId2Lut = piVar8;
  memset(piVar7,0xff,__size);
  memset(piVar8,0xff,__size_00);
  iVar15 = p->nEdgeHash;
  if (0 < (long)iVar15) {
    ppNVar4 = p->pEdgeHash;
    lVar17 = 0;
    do {
      pNVar14 = ppNVar4[lVar17];
      if (pNVar14 != (Nwk_Edg_t *)0x0) {
        iVar13 = p->nObjs;
        do {
          if (iVar13 < pNVar14->iNode1) {
            __assert_fail("pEntry->iNode1 <= p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                          ,0x121,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
          }
          if (iVar13 < pNVar14->iNode2) {
            __assert_fail("pEntry->iNode2 <= p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                          ,0x122,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
          }
          piVar7[pNVar14->iNode1] = 0;
          piVar7[pNVar14->iNode2] = 0;
          pNVar14 = pNVar14->pNext;
        } while (pNVar14 != (Nwk_Edg_t *)0x0);
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != iVar15);
  }
  p->nVerts = 0;
  iVar15 = p->nObjs;
  if (-1 < iVar15) {
    iVar15 = p->nObjs;
    uVar9 = 0;
    iVar13 = 0;
    if (0 < iVar15) {
      iVar13 = iVar15;
    }
    do {
      if (piVar7[uVar9] == 0) {
        iVar1 = p->nVerts;
        iVar16 = iVar1 + 1;
        p->nVerts = iVar16;
        piVar7[uVar9] = iVar16;
        piVar8[(long)iVar1 + 1] = (int)uVar9;
      }
      uVar9 = uVar9 + 1;
    } while (iVar13 + 1 != uVar9);
  }
  iVar13 = p->nVerts;
  __ptr = calloc((long)iVar13 + 1,4);
  iVar1 = p->nEdgeHash;
  if (0 < (long)iVar1) {
    ppNVar4 = p->pEdgeHash;
    lVar17 = 0;
    do {
      for (pNVar14 = ppNVar4[lVar17]; pNVar14 != (Nwk_Edg_t *)0x0; pNVar14 = pNVar14->pNext) {
        if (iVar15 < pNVar14->iNode1) {
          __assert_fail("pEntry->iNode1 <= p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                        ,0x135,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
        }
        if (iVar15 < pNVar14->iNode2) {
          __assert_fail("pEntry->iNode2 <= p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                        ,0x136,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
        }
        iVar16 = piVar7[pNVar14->iNode1];
        pNVar14->iNode1 = iVar16;
        iVar2 = piVar7[pNVar14->iNode2];
        pNVar14->iNode2 = iVar2;
        if (iVar13 < iVar16) {
          __assert_fail("pEntry->iNode1 <= p->nVerts",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                        ,0x13a,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
        }
        if (iVar13 < iVar2) {
          __assert_fail("pEntry->iNode2 <= p->nVerts",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                        ,0x13b,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
        }
        piVar8 = (int *)((long)__ptr + (long)iVar16 * 4);
        *piVar8 = *piVar8 + 1;
        piVar8 = (int *)((long)__ptr + (long)iVar2 * 4);
        *piVar8 = *piVar8 + 1;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != iVar1);
  }
  pAVar10 = Aig_MmFlexStart();
  p->pMemVerts = pAVar10;
  ppNVar11 = (Nwk_Vrt_t **)malloc((long)p->nVerts * 8 + 8);
  p->pVerts = ppNVar11;
  *ppNVar11 = (Nwk_Vrt_t *)0x0;
  if (0 < p->nVerts) {
    lVar17 = 1;
    do {
      iVar15 = *(int *)((long)__ptr + lVar17 * 4);
      if (iVar15 < 1) {
        __assert_fail("pnEdges[i] > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                      ,0x145,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
      }
      iVar15 = iVar15 * 4 + 0x10;
      pNVar12 = (Nwk_Vrt_t *)Aig_MmFlexEntryFetch(p->pMemVerts,iVar15);
      p->pVerts[lVar17] = pNVar12;
      memset(p->pVerts[lVar17],0,(long)iVar15);
      p->pVerts[lVar17]->Id = (int)lVar17;
      bVar6 = lVar17 < p->nVerts;
      lVar17 = lVar17 + 1;
    } while (bVar6);
  }
  if (0 < p->nEdgeHash) {
    ppNVar4 = p->pEdgeHash;
    lVar17 = 0;
    do {
      pNVar14 = ppNVar4[lVar17];
      if (pNVar14 != (Nwk_Edg_t *)0x0) {
        ppNVar11 = p->pVerts;
        do {
          pNVar12 = ppNVar11[pNVar14->iNode1];
          iVar15 = pNVar14->iNode2;
          iVar13 = pNVar12->nEdges;
          pNVar12->nEdges = iVar13 + 1;
          (&pNVar12[1].Id)[iVar13] = iVar15;
          pNVar12 = ppNVar11[pNVar14->iNode2];
          iVar15 = pNVar14->iNode1;
          iVar13 = pNVar12->nEdges;
          pNVar12->nEdges = iVar13 + 1;
          (&pNVar12[1].Id)[iVar13] = iVar15;
          pNVar14 = pNVar14->pNext;
        } while (pNVar14 != (Nwk_Edg_t *)0x0);
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < p->nEdgeHash);
  }
  if (0 < p->nVerts) {
    ppNVar11 = p->pVerts;
    lVar17 = 0;
    do {
      pNVar12 = ppNVar11[lVar17 + 1];
      uVar3 = pNVar12->nEdges;
      if (uVar3 != *(uint *)((long)__ptr + lVar17 * 4 + 4)) {
        __assert_fail("p->pVerts[i]->nEdges == pnEdges[i]",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                      ,0x156,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
      }
      if ((int)uVar3 < 1) {
        __assert_fail("pVertex->nEdges > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                      ,0xd5,"void Nwk_ManGraphListInsert(Nwk_Grf_t *, Nwk_Vrt_t *)");
      }
      if (uVar3 == 1) {
        if ((long)ppNVar11[pNVar12[1].Id]->nEdges < 0x10) {
          piVar7 = p->pLists1 + ppNVar11[pNVar12[1].Id]->nEdges;
LAB_00495e12:
          iVar15 = *piVar7;
        }
        else {
          iVar15 = p->pLists1[0x10];
          piVar7 = p->pLists1 + 0x10;
        }
      }
      else {
        if ((int)uVar3 < 0x10) {
          piVar7 = p->pLists2 + uVar3;
          goto LAB_00495e12;
        }
        iVar15 = p->pLists2[0x10];
        piVar7 = p->pLists2 + 0x10;
      }
      if (iVar15 != 0) {
        pNVar5 = ppNVar11[iVar15];
        pNVar12->iPrev = 0;
        pNVar12->iNext = pNVar5->Id;
        pNVar5->iPrev = pNVar12->Id;
      }
      *piVar7 = pNVar12->Id;
      lVar17 = lVar17 + 1;
    } while (lVar17 < p->nVerts);
  }
  Aig_MmFixedStop(p->pMemEdges,0);
  p->pMemEdges = (Aig_MmFixed_t *)0x0;
  if (p->pEdgeHash != (Nwk_Edg_t **)0x0) {
    free(p->pEdgeHash);
    p->pEdgeHash = (Nwk_Edg_t **)0x0;
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void Nwk_ManGraphPrepare( Nwk_Grf_t * p )
{
    Nwk_Edg_t * pEntry;
    Nwk_Vrt_t * pVertex;
    int * pnEdges, nBytes, i;
    // allocate memory for the present objects
    p->pMapLut2Id = ABC_ALLOC( int, p->nObjs+1 );
    p->pMapId2Lut = ABC_ALLOC( int, p->nVertsMax+1 );
    memset( p->pMapLut2Id, 0xff, sizeof(int) * (p->nObjs+1) );
    memset( p->pMapId2Lut, 0xff, sizeof(int) * (p->nVertsMax+1) );
    // mark present objects
    Nwk_GraphForEachEdge( p, pEntry, i )
    {
        assert( pEntry->iNode1 <= p->nObjs );
        assert( pEntry->iNode2 <= p->nObjs );
        p->pMapLut2Id[ pEntry->iNode1 ] = 0;
        p->pMapLut2Id[ pEntry->iNode2 ] = 0;
    }
    // map objects
    p->nVerts = 0;
    for ( i = 0; i <= p->nObjs; i++ )
    {
        if ( p->pMapLut2Id[i] == 0 )
        {
            p->pMapLut2Id[i] = ++p->nVerts;
            p->pMapId2Lut[p->nVerts] = i;
        }
    }
    // count the edges and mark present objects
    pnEdges = ABC_CALLOC( int, p->nVerts+1 );
    Nwk_GraphForEachEdge( p, pEntry, i )
    {
        // translate into vertices
        assert( pEntry->iNode1 <= p->nObjs );
        assert( pEntry->iNode2 <= p->nObjs );
        pEntry->iNode1 = p->pMapLut2Id[pEntry->iNode1];
        pEntry->iNode2 = p->pMapLut2Id[pEntry->iNode2];
        // count the edges
        assert( pEntry->iNode1 <= p->nVerts );
        assert( pEntry->iNode2 <= p->nVerts );
        pnEdges[pEntry->iNode1]++;
        pnEdges[pEntry->iNode2]++;
    }
    // allocate the real graph
    p->pMemVerts  = Aig_MmFlexStart();
    p->pVerts = ABC_ALLOC( Nwk_Vrt_t *, p->nVerts + 1 );
    p->pVerts[0] = NULL;
    for ( i = 1; i <= p->nVerts; i++ )
    {
        assert( pnEdges[i] > 0 );
        nBytes = sizeof(Nwk_Vrt_t) + sizeof(int) * pnEdges[i];
        p->pVerts[i] = (Nwk_Vrt_t *)Aig_MmFlexEntryFetch( p->pMemVerts, nBytes );
        memset( p->pVerts[i], 0, nBytes );
        p->pVerts[i]->Id = i;
    }
    // add edges to the real graph
    Nwk_GraphForEachEdge( p, pEntry, i )
    {
        pVertex = p->pVerts[pEntry->iNode1];
        pVertex->pEdges[ pVertex->nEdges++ ] = pEntry->iNode2;
        pVertex = p->pVerts[pEntry->iNode2];
        pVertex->pEdges[ pVertex->nEdges++ ] = pEntry->iNode1;
    }
    // put vertices into the data structure
    for ( i = 1; i <= p->nVerts; i++ )
    {
        assert( p->pVerts[i]->nEdges == pnEdges[i] );
        Nwk_ManGraphListInsert( p, p->pVerts[i] );
    }
    // clean up
    Aig_MmFixedStop( p->pMemEdges, 0 ); p->pMemEdges = NULL;
    ABC_FREE( p->pEdgeHash );
//    p->nEdgeHash = 0;
    ABC_FREE( pnEdges );
}